

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O2

bool BicTest3<Blob<128>,unsigned_int>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int out2;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int keybit;
  int iVar11;
  ulong uVar12;
  int out1;
  ulong uVar13;
  bool bVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined8 in_XMM7_Qb;
  uint local_a8;
  allocator_type local_a1;
  double local_a0;
  ulong local_98;
  uint h2;
  uint h1;
  long local_88;
  ulong local_80;
  long local_78;
  value_type_conflict1 local_6c;
  vector<int,_std::allocator<int>_> bins;
  Rand r;
  Blob<128> key;
  
  Rand::reseed(&r,0x2ea2);
  Blob<128>::Blob(&key);
  local_6c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&bins,0x80000,&local_6c,&local_a1);
  local_a0 = (double)CONCAT44(local_a0._4_4_,~(reps >> 0x1f) & reps);
  local_98 = 0x10;
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
    if ((char)(((ushort)lVar2 & 0xff) % 0xc) == '\0') {
      putchar(0x2e);
    }
    lVar9 = (long)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start + local_98;
    for (iVar11 = 0; iVar11 != local_a0._0_4_; iVar11 = iVar11 + 1) {
      Rand::rand_p(&r,&key,0x10);
      (*hash)(&key,0x10,0,&h1);
      flipbit<Blob<128>>(&key,(uint32_t)lVar2);
      (*hash)(&key,0x10,0,&h2);
      lVar4 = -0x1f;
      lVar3 = lVar9;
      for (lVar6 = 0; lVar6 != 0x1f; lVar6 = lVar6 + 1) {
        lVar7 = lVar3;
        for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + 1) {
          piVar1 = (int *)(lVar7 + (ulong)(((h2 ^ h1) >> ((uint)lVar6 & 0x1f) & 1) +
                                          ((h2 ^ h1) >> ((uint)lVar8 & 0x1f) & 1) * 2) * 4);
          *piVar1 = *piVar1 + 1;
          lVar7 = lVar7 + 0x10;
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x210;
      }
    }
    local_98 = local_98 + 0x4000;
  }
  putchar(10);
  dVar19 = (double)(reps / 2);
  auVar15 = ZEXT864(0) << 0x40;
  uVar5 = 1;
  auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  local_88 = 0x10;
  uVar10 = 0;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8 = 0;
  local_a0 = dVar19;
  for (uVar13 = 0; lVar2 = local_88, uVar12 = uVar5, uVar13 != 0x1f; uVar13 = uVar13 + 1) {
    for (; local_80 = uVar12, uVar5 != 0x20; uVar5 = uVar5 + 1) {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar13 & 0xffffffff,uVar5 & 0xffffffff);
        auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar15 = ZEXT864(auVar15._0_8_);
        dVar19 = local_a0;
      }
      local_78 = lVar2;
      for (uVar12 = 0; uVar12 != 0x80; uVar12 = uVar12 + 1) {
        auVar18 = ZEXT816(0) << 0x40;
        lVar9 = 0;
        while (lVar9 != 4) {
          lVar4 = lVar9 * 4;
          lVar9 = lVar9 + 1;
          auVar16._0_8_ =
               (double)*(int *)((long)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar4 + lVar2) / dVar19;
          auVar16._8_8_ = in_XMM7_Qb;
          auVar16 = vfmadd213sd_fma(auVar16,auVar20._0_16_,auVar21._0_16_);
          auVar16 = vandpd_avx(auVar16,auVar22._0_16_);
          auVar18 = vmaxsd_avx(auVar16,auVar18);
        }
        dVar17 = auVar18._0_8_;
        if (auVar15._0_8_ < dVar17) {
          local_98 = CONCAT44(local_98._4_4_,(int)uVar5);
          uVar10 = uVar12 & 0xffffffff;
          auVar15 = ZEXT1664(auVar18);
          local_a8 = (uint)uVar13;
        }
        if (verbose) {
          iVar11 = 0x2e;
          if ((0.01 <= dVar17) && (iVar11 = 0x6f, 0.05 <= dVar17)) {
            iVar11 = (uint)(0.33 <= dVar17) * 9 + 0x4f;
          }
          putchar(iVar11);
          auVar15 = ZEXT864(auVar15._0_8_);
          auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
          dVar19 = local_a0;
        }
        lVar2 = lVar2 + 0x4000;
      }
      if (verbose) {
        putchar(10);
        auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar15 = ZEXT864((ulong)auVar15._0_8_);
        dVar19 = local_a0;
      }
      lVar2 = local_78 + 0x10;
      uVar12 = local_80;
    }
    if (verbose) {
      iVar11 = 0x8c;
      while (bVar14 = iVar11 != 0, iVar11 = iVar11 + -1, bVar14) {
        putchar(0x2d);
      }
      putchar(10);
      auVar15 = ZEXT864(auVar15._0_8_);
      auVar20 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar21 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar22 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      dVar19 = local_a0;
    }
    local_88 = local_88 + 0x210;
    uVar5 = local_80 + 1;
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar10,(ulong)local_a8,local_98 & 0xffffffff);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bins.super__Vector_base<int,_std::allocator<int>_>);
  return auVar15._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}